

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValidateDataStructure.cpp
# Opt level: O2

void __thiscall Assimp::ValidateDSProcess::Execute(ValidateDSProcess *this,aiScene *pScene)

{
  Logger *pLVar1;
  char *msg;
  ValidateDSProcess *this_00;
  
  this->mScene = pScene;
  pLVar1 = DefaultLogger::get();
  Logger::debug(pLVar1,"ValidateDataStructureProcess begin");
  this_00 = this;
  Validate(this,pScene->mRootNode);
  if (pScene->mNumMeshes == 0) {
    if ((this->mScene->mFlags & 1) == 0) {
      msg = "aiScene::mNumMeshes is 0. At least one mesh must be there";
      goto LAB_001303c7;
    }
    if (pScene->mMeshes != (aiMesh **)0x0) {
      msg = "aiScene::mMeshes is non-null although there are no meshes";
      goto LAB_001303c7;
    }
  }
  else {
    this_00 = this;
    DoValidation<aiMesh>(this,pScene->mMeshes,pScene->mNumMeshes,"mMeshes","mNumMeshes");
  }
  if (pScene->mNumAnimations == 0) {
    if (pScene->mAnimations != (aiAnimation **)0x0) {
      msg = "aiScene::mAnimations is non-null although there are no animations";
      goto LAB_001303c7;
    }
  }
  else {
    this_00 = this;
    DoValidation<aiAnimation>
              (this,pScene->mAnimations,pScene->mNumAnimations,"mAnimations","mNumAnimations");
  }
  if (pScene->mNumCameras == 0) {
    if (pScene->mCameras != (aiCamera **)0x0) {
      msg = "aiScene::mCameras is non-null although there are no cameras";
      goto LAB_001303c7;
    }
  }
  else {
    this_00 = this;
    DoValidationWithNameCheck<aiCamera>
              (this,pScene->mCameras,pScene->mNumCameras,"mCameras","mNumCameras");
  }
  if (pScene->mNumLights == 0) {
    if (pScene->mLights != (aiLight **)0x0) {
      msg = "aiScene::mLights is non-null although there are no lights";
      goto LAB_001303c7;
    }
  }
  else {
    this_00 = this;
    DoValidationWithNameCheck<aiLight>
              (this,pScene->mLights,pScene->mNumLights,"mLights","mNumLights");
  }
  if (pScene->mNumTextures == 0) {
    if (pScene->mTextures != (aiTexture **)0x0) {
      msg = "aiScene::mTextures is non-null although there are no textures";
      goto LAB_001303c7;
    }
  }
  else {
    this_00 = this;
    DoValidation<aiTexture>(this,pScene->mTextures,pScene->mNumTextures,"mTextures","mNumTextures");
  }
  if (pScene->mNumMaterials == 0) {
    if (pScene->mMaterials != (aiMaterial **)0x0) {
      msg = "aiScene::mMaterials is non-null although there are no materials";
LAB_001303c7:
      ReportError(this_00,msg);
    }
  }
  else {
    DoValidation<aiMaterial>
              (this,pScene->mMaterials,pScene->mNumMaterials,"mMaterials","mNumMaterials");
  }
  pLVar1 = DefaultLogger::get();
  Logger::debug(pLVar1,"ValidateDataStructureProcess end");
  return;
}

Assistant:

void ValidateDSProcess::Execute( aiScene* pScene) {
    mScene = pScene;
    ASSIMP_LOG_DEBUG("ValidateDataStructureProcess begin");

    // validate the node graph of the scene
    Validate(pScene->mRootNode);

    // validate all meshes
    if (pScene->mNumMeshes) {
        DoValidation(pScene->mMeshes,pScene->mNumMeshes,"mMeshes","mNumMeshes");
    }
    else if (!(mScene->mFlags & AI_SCENE_FLAGS_INCOMPLETE)) {
        ReportError("aiScene::mNumMeshes is 0. At least one mesh must be there");
    }
    else if (pScene->mMeshes)   {
        ReportError("aiScene::mMeshes is non-null although there are no meshes");
    }

    // validate all animations
    if (pScene->mNumAnimations) {
        DoValidation(pScene->mAnimations,pScene->mNumAnimations,
            "mAnimations","mNumAnimations");
    }
    else if (pScene->mAnimations)   {
        ReportError("aiScene::mAnimations is non-null although there are no animations");
    }

    // validate all cameras
    if (pScene->mNumCameras) {
        DoValidationWithNameCheck(pScene->mCameras,pScene->mNumCameras,
            "mCameras","mNumCameras");
    }
    else if (pScene->mCameras)  {
        ReportError("aiScene::mCameras is non-null although there are no cameras");
    }

    // validate all lights
    if (pScene->mNumLights) {
        DoValidationWithNameCheck(pScene->mLights,pScene->mNumLights,
            "mLights","mNumLights");
    }
    else if (pScene->mLights)   {
        ReportError("aiScene::mLights is non-null although there are no lights");
    }

    // validate all textures
    if (pScene->mNumTextures) {
        DoValidation(pScene->mTextures,pScene->mNumTextures,
            "mTextures","mNumTextures");
    }
    else if (pScene->mTextures) {
        ReportError("aiScene::mTextures is non-null although there are no textures");
    }

    // validate all materials
    if (pScene->mNumMaterials) {
        DoValidation(pScene->mMaterials,pScene->mNumMaterials,"mMaterials","mNumMaterials");
    }
#if 0
    // NOTE: ScenePreprocessor generates a default material if none is there
    else if (!(mScene->mFlags & AI_SCENE_FLAGS_INCOMPLETE)) {
        ReportError("aiScene::mNumMaterials is 0. At least one material must be there");
    }
#endif
    else if (pScene->mMaterials)    {
        ReportError("aiScene::mMaterials is non-null although there are no materials");
    }

//  if (!has)ReportError("The aiScene data structure is empty");
    ASSIMP_LOG_DEBUG("ValidateDataStructureProcess end");
}